

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::texcoord3f>
          (GeomPrimvar *this,texcoord3f *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  uint32_t uVar3;
  texcoord3f *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar5;
  bool bVar6;
  undefined3 uStack_a8;
  undefined5 local_a5;
  undefined3 uStack_a0;
  float local_9d;
  long local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_65;
  float local_5d;
  undefined1 local_54 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (dest == (texcoord3f *)0x0) {
joined_r0x001bf0e1:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar5 = false;
      }
      else {
        uVar3 = (*pvVar1->type_id)();
        bVar5 = uVar3 == 4;
      }
      if ((bVar5) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001bf0e1;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar6 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = !bVar6;
        if (bVar6) {
          if (err == (string *)0x0) {
            return bVar5;
          }
          std::__cxx11::string::append((char *)err);
          return bVar5;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        ptVar4 = tinyusdz::value::Value::as<tinyusdz::value::texcoord3f>(&pSVar2->value,false);
        if (ptVar4 != (texcoord3f *)0x0) {
          dest->r = ptVar4->r;
          local_65._0_4_ = ptVar4->s;
          local_65._4_4_ = ptVar4->t;
          local_88[0] = bVar5;
          goto LAB_001bf221;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar3 = Attribute::type_id(this_00);
      bVar5 = IsSupportedGeomPrimvarType(uVar3);
      if (bVar5) {
        primvar::PrimVar::get_value<tinyusdz::value::texcoord3f>
                  ((optional<tinyusdz::value::texcoord3f> *)local_88,&(this->_attr)._var);
        if ((bool)local_88[0] == true) {
          local_9d = (float)local_88._12_4_;
          local_65 = CONCAT44(local_88._8_4_,local_88._4_4_);
          uStack_a0 = SUB43(local_88._8_4_,1);
          local_5d = (float)local_88._12_4_;
        }
        if ((bool)local_88[0] == false) {
          if (err == (string *)0x0) {
            return false;
          }
          uStack_a8 = SUB83(local_98,0);
          local_a5 = (undefined5)((ulong)local_98 >> 0x18);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&uStack_a8,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_54._0_4_ = 0x4d;
          Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)local_88,(fmt *)&uStack_a8,(string *)local_54,(uint *)(local_54 + 4),
                     in_R8);
          std::__cxx11::string::_M_append((char *)err,CONCAT44(local_88._4_4_,local_88._0_4_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_88._4_4_,local_88._0_4_) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_88._4_4_,local_88._0_4_),
                            local_78._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_54._4_8_ != &local_40) {
            operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT53(local_a5,uStack_a8) == local_98) {
            return false;
          }
          operator_delete((long *)CONCAT53(local_a5,uStack_a8),local_98[0] + 1);
          return false;
        }
        dest->r = local_5d;
LAB_001bf221:
        dest->s = (float)(int)local_65;
        dest->t = (float)(int)((ulong)local_65 >> 0x20);
        return (bool)local_88[0];
      }
      if (err != (string *)0x0) {
        uStack_a8 = SUB83(local_98,0);
        local_a5 = (undefined5)((ulong)local_98 >> 0x18);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uStack_a8,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_54 + 4),this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_88,(fmt *)&uStack_a8,(string *)(local_54 + 4),in_RCX);
        std::__cxx11::string::_M_append((char *)err,CONCAT44(local_88._4_4_,local_88._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_88._4_4_,local_88._0_4_) != &local_78) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_88._4_4_,local_88._0_4_),
                          local_78._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_54._4_8_ != &local_40) {
          operator_delete((void *)local_54._4_8_,local_40._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT53(local_a5,uStack_a8) != local_98) {
          operator_delete((long *)CONCAT53(local_a5,uStack_a8),local_98[0] + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}